

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall
restincurl::RequestBuilder::StoreData<std::__cxx11::string>
          (RequestBuilder *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  pointer this_00;
  RequestBuilder *pRVar1;
  unique_ptr<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
  local_40 [3];
  type local_28;
  InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *handler_ref;
  __single_object handler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_local;
  RequestBuilder *this_local;
  
  handler._M_t.
  super___uniq_ptr_impl<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
        )(__uniq_ptr_data<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
          )data;
  if (((this->is_built_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_built_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x5c4,
                  "RequestBuilder &restincurl::RequestBuilder::StoreData(T &) [T = std::basic_string<char>]"
                 );
  }
  std::make_unique<restincurl::InDataHandler<std::__cxx11::string>,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handler_ref);
  local_28 = std::
             unique_ptr<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((unique_ptr<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&handler_ref);
  this_00 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
            operator->(&this->request_);
  std::unique_ptr<restincurl::DataHandlerBase,std::default_delete<restincurl::DataHandlerBase>>::
  unique_ptr<restincurl::InDataHandler<std::__cxx11::string>,std::default_delete<restincurl::InDataHandler<std::__cxx11::string>>,void>
            ((unique_ptr<restincurl::DataHandlerBase,std::default_delete<restincurl::DataHandlerBase>>
              *)local_40,
             (unique_ptr<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&handler_ref);
  Request::SetDefaultInHandler(this_00,local_40);
  std::unique_ptr<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>::
  ~unique_ptr(local_40);
  pRVar1 = StoreData<std::__cxx11::string>(this,local_28);
  std::
  unique_ptr<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr((unique_ptr<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<restincurl::InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&handler_ref);
  return pRVar1;
}

Assistant:

RequestBuilder& StoreData(T& data) {
            assert(!is_built_);
            auto handler = std::make_unique<InDataHandler<T>>(data);
            auto& handler_ref = *handler;
            request_->SetDefaultInHandler(std::move(handler));
            return StoreData(handler_ref);
        }